

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O1

void __thiscall CTcLibParser::parse_lib(CTcLibParser *this)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  CTcSrcFile *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char buf2 [128];
  char expbuf [1024];
  char buf [1024];
  undefined8 local_8c0;
  undefined1 local_8b8 [127];
  char local_839;
  char local_838 [1023];
  char acStack_439 [1033];
  undefined4 extraout_var_01;
  
  pCVar4 = CTcSrcFile::open_ascii(this->lib_name_);
  if (pCVar4 == (CTcSrcFile *)0x0) {
    (*this->_vptr_CTcLibParser[2])(this);
    this->err_cnt_ = this->err_cnt_ + 1;
  }
  else {
    do {
      iVar2 = (*(pCVar4->super_CTcSrcObject)._vptr_CTcSrcObject[2])(pCVar4,acStack_439 + 1,0x400);
      lVar6 = CONCAT44(extraout_var,iVar2);
      if (lVar6 == 0) break;
      this->linenum_ = this->linenum_ + 1;
      lVar8 = lVar6 + -1;
      if (lVar8 != 0) {
        do {
          if ((acStack_439[lVar8] != '\r') && (acStack_439[lVar8] != '\n')) goto LAB_001f9acc;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        lVar8 = 0;
      }
LAB_001f9acc:
      local_8c0 = lVar6;
      if (acStack_439[lVar8 + 1] == '\0') {
        iVar2 = (*(pCVar4->super_CTcSrcObject)._vptr_CTcSrcObject[2])(pCVar4,local_8b8,0x80);
        lVar6 = CONCAT44(extraout_var_00,iVar2);
        if (lVar6 == 0) goto LAB_001f9adb;
        (*this->_vptr_CTcLibParser[3])(this);
        this->err_cnt_ = this->err_cnt_ + 1;
        lVar5 = lVar6;
        do {
          if ((lVar5 != 1) && ((cVar1 = local_8b8[lVar5 + -2], cVar1 == '\n' || (cVar1 == '\r'))))
          break;
          iVar2 = (*(pCVar4->super_CTcSrcObject)._vptr_CTcSrcObject[2])(pCVar4,local_8b8,0x80);
          lVar5 = CONCAT44(extraout_var_01,iVar2);
        } while (lVar5 != 0);
        if (lVar6 == 0) goto LAB_001f9adb;
      }
      else {
LAB_001f9adb:
        acStack_439[lVar8 + 1] = '\0';
        pcVar11 = local_838;
        pcVar7 = acStack_439;
        do {
          while( true ) {
            pcVar7 = pcVar7 + 1;
            if (*pcVar7 == '$') break;
            if (*pcVar7 == '\0') goto LAB_001f9c0c;
LAB_001f9bd7:
            if (pcVar11 + (-0x3ff - (long)local_838) < (char *)0xfffffffffffffbff) {
              (*this->_vptr_CTcLibParser[4])(this);
              goto LAB_001f9c0c;
            }
            *pcVar11 = *pcVar7;
            pcVar11 = pcVar11 + 1;
          }
          if (pcVar7[1] == '$') {
            pcVar7 = pcVar7 + 1;
            goto LAB_001f9bd7;
          }
          if (pcVar7[1] != '(') {
            (*this->_vptr_CTcLibParser[8])(this);
            goto LAB_001f9bd7;
          }
          lVar6 = 0;
          pcVar9 = pcVar7 + 2;
          for (pcVar10 = pcVar9; *pcVar10 != '\0'; pcVar10 = pcVar10 + 1) {
            if (*pcVar10 == ')') {
              uVar3 = (*this->_vptr_CTcLibParser[0x15])
                                (this,pcVar11,acStack_439 + (1 - (long)pcVar11),pcVar9,lVar6);
              if ((int)uVar3 < 0) {
                (*this->_vptr_CTcLibParser[7])(this,pcVar9,lVar6);
              }
              else {
                if (acStack_439 + (1 - (long)pcVar11) < (char *)(ulong)uVar3) {
                  (*this->_vptr_CTcLibParser[4])(this);
                  iVar2 = 8;
                  pcVar7 = pcVar9;
                  goto LAB_001f9bc1;
                }
                pcVar11 = pcVar11 + (long)(ulong)uVar3;
              }
              iVar2 = 10;
              pcVar7 = pcVar10;
              goto LAB_001f9bc1;
            }
            lVar6 = lVar6 + 1;
          }
          (*this->_vptr_CTcLibParser[8])(this);
          iVar2 = 0;
LAB_001f9bc1:
          if (iVar2 == 0) goto LAB_001f9bd7;
        } while (iVar2 == 10);
LAB_001f9c0c:
        *pcVar11 = '\0';
        pcVar11 = &local_839;
        do {
          pcVar7 = pcVar11;
          pcVar11 = pcVar7 + 1;
          cVar1 = pcVar7[1];
          iVar2 = isspace((int)cVar1);
        } while (iVar2 != 0);
        if ((cVar1 != '\0') && (pcVar9 = pcVar11, cVar1 != '#')) {
          while ((cVar1 = *pcVar9, cVar1 != '\0' &&
                 ((cVar1 != ':' && (iVar2 = isspace((int)cVar1), iVar2 == 0))))) {
            pcVar7 = pcVar7 + 1;
            pcVar9 = pcVar9 + 1;
          }
          do {
            cVar1 = pcVar7[1];
            pcVar7 = pcVar7 + 1;
            iVar2 = isspace((int)cVar1);
          } while (iVar2 != 0);
          if (cVar1 == ':') {
            *pcVar9 = '\0';
            do {
              pcVar9 = pcVar7 + 1;
              pcVar7 = pcVar7 + 1;
              iVar2 = isspace((int)*pcVar9);
            } while (iVar2 != 0);
            (*this->_vptr_CTcLibParser[0xb])(this,pcVar11,pcVar7);
          }
          else {
            iVar2 = stricmp(pcVar11,"nodef");
            if (iVar2 == 0) {
              (*this->_vptr_CTcLibParser[0x16])(this);
            }
            else {
              (*this->_vptr_CTcLibParser[5])();
              this->err_cnt_ = this->err_cnt_ + 1;
            }
          }
        }
      }
    } while (local_8c0 != 0);
    (*(pCVar4->super_CTcSrcObject)._vptr_CTcSrcObject[1])(pCVar4);
  }
  return;
}

Assistant:

void CTcLibParser::parse_lib()
{
    CTcSrcFile *fp;

    /* open our file - we only accept plain ASCII here */
    fp = CTcSrcFile::open_ascii(lib_name_);

    /* if that failed, abort */
    if (fp == 0)
    {
        err_open_file();
        ++err_cnt_;
        return;
    }

    /* keep going until we run out of file */
    for (;;)
    {
        char buf[1024];
        char expbuf[1024];
        size_t len;
        char *p;
        char *dst;
        char *sep;
        char *var_name;
        char *var_val;

        /* read the next line of text */
        if ((len = fp->read_line(buf, sizeof(buf))) == 0)
            break;

        /* count the line */
        ++linenum_;

        /* un-count the terminating null byte in the length */
        --len;

        /* check for a terminating newline sequence */
        while (len != 0 && (buf[len-1] == '\n' || buf[len-1] == '\r'))
            --len;

        /* if we didn't find a newline, the line is too long */
        if (buf[len] == '\0')
        {
            char buf2[128];
            size_t len2;
            
            /* 
             *   If we can read anything more from the file, this indicates
             *   that the line was simply too long to read into our buffer;
             *   skip the rest of the line and log an error in this case.
             *   If we can't read any more text, it means we've reached the
             *   end of the file. 
             */
            if ((len2 = fp->read_line(buf2, sizeof(buf2))) != 0)
            {
                /* there's more, so the line is too long - flag an error */
                err_line_too_long();
                ++err_cnt_;

                /* skip text until we find a newline */
                for (;;)
                {
                    /* un-count the null terminator */
                    --len2;

                    /* if we've found our newline, we're done skipping */
                    if (len2 != 0
                        && (buf2[len2-1] == '\n' || buf2[len2-1] == '\r'))
                        break;
                    
                    /* read another chunk */
                    if ((len2 = fp->read_line(buf2, sizeof(buf2))) == 0)
                        break;
                }

                /* we've skipped the line, so go back for the next */
                continue;
            }
        }

        /* remove the newline from the buffer */
        buf[len] = '\0';

        /* scan for and expand preprocessor symbols */
        for (p = buf, dst = expbuf ; *p != '\0' ; ++p)
        {
            /* check for the start of a preprocessor symbol */
            if (*p == '$')
            {
                /* 
                 *   We have a dollar sign, so this *could* be a preprocessor
                 *   symbol.  If the next character is '(', then find the
                 *   matching ')', and take the part between the parentheses
                 *   as a symbol to expand.  If the next character is '$',
                 *   replace the pair with a single dollar sign.  If the next
                 *   character is anything else, the '$' is not significant,
                 *   so leave it as it is.  
                 */
                if (*(p+1) == '(')
                {
                    char *closep;

                    /* find the close paren */
                    for (closep = p + 2 ; *closep != '\0' && *closep != ')' ;
                         ++closep) ;

                    /* 
                     *   if we found the close paren, process it; if not,
                     *   just ignore the whole thing and treat the '$(' as a
                     *   pair of ordinary characters 
                     */
                    if (*closep == ')')
                    {
                        int vallen;
                        size_t symlen;
                        size_t rem;

                        /* skip to the start of the symbol name */
                        p += 2;

                        /* get the length of the symbol */
                        symlen = closep - p;

                        /* figure out how much space we have left */
                        rem = sizeof(expbuf) - (dst - expbuf);

                        /* look up the symbol's value */
                        vallen = get_pp_symbol(dst, rem, p, symlen);

                        /* note overflow or undefined symbol errors */
                        if (vallen < 0)
                        {
                            /* it's undefined - note it */
                            err_undef_sym(p, symlen);
                        }
                        else if ((size_t)vallen > rem)
                        {
                            /* it's too long - note it and give up now */
                            err_expanded_line_too_long();
                            break;
                        }
                        else
                        {
                            /* success - advance past the value */
                            dst += vallen;
                        }

                        /* 
                         *   Skip to the close paren and continue with the
                         *   main loop.  We don't need to copy any input for
                         *   the symbol, because we've already copied the
                         *   expansion instead; so just go back to the start
                         *   of the input loop.  
                         */
                        p = closep;
                        continue;
                    }
                    else
                    {
                        /* ill-formed macro substitution expression */
                        err_invalid_dollar();
                    }
                }
                else if (*(p+1) == '$')
                {
                    /* 
                     *   we have a double dollar sign, so turn it into a
                     *   single dollar sign - simply skip the first of the
                     *   pair so we only keep one 
                     */
                    ++p;
                }
                else
                {
                    /* invalid '$' sequence - warn about it */
                    err_invalid_dollar();
                }
            }

            /* make sure we have room for this character plus a null byte */
            if ((dst - expbuf) + 2 > sizeof(expbuf))
            {
                err_expanded_line_too_long();
                break;
            }

            /* copy this character to the destination string */
            *dst++ = *p;
        }

        /* null-terminate the expanded buffer */
        *dst = '\0';

        /* skip leading spaces */
        for (p = expbuf ; isspace(*p) ; ++p) ;

        /* if the line is empty or starts with '#', skip it */
        if (*p == '\0' || *p == '#')
            continue;

        /* the variable name starts here */
        var_name = p;

        /* the variable name ends at the next space or colon */
        for ( ; *p != '\0' && *p != ':' && !isspace(*p) ; ++p) ;

        /* note where the variable name ends */
        sep = p;

        /* skip spaces after the end of the variable name */
        for ( ; isspace(*p) ; ++p) ;

        /* 
         *   if we didn't find a colon after the variable name, it's an
         *   error; flag the error and skip the line 
         */
        if (*p != ':')
        {
            /* check for stand-alone flags */
            if (stricmp(var_name, "nodef") == 0)
            {
                /* scan the "nodef" flag */
                scan_nodef();
            }
            else
            {
                /* 
                 *   it's not a valid stand-alone flag; the definition must
                 *   be missing the value portion 
                 */
                err_missing_colon();
                ++err_cnt_;
            }

            /* we're done with this line now */
            continue;
        }

        /* put a null terminator at the end of the variable name */
        *sep = '\0';

        /* skip any spaces after the colon */
        for (++p ; isspace(*p) ; ++p) ;

        /* the value starts here */
        var_val = p;

        /* scan the value */
        scan_var(var_name, var_val);
    }

    /* we're done - close the file */
    delete fp;
}